

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkForCustomUnit(string *unit_string)

{
  char *pcVar1;
  long *plVar2;
  string *psVar3;
  ushort uVar4;
  int iVar5;
  uint32_t uVar6;
  unit_data uVar7;
  ulong uVar8;
  long lVar9;
  string *psVar10;
  bool bVar11;
  double dVar12;
  precise_unit pVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  long *local_60;
  string *local_58;
  long local_50 [2];
  string local_40;
  
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  lVar9 = -1;
  if (*pcVar1 == '{') {
    if (pcVar1[unit_string->_M_string_length - 1] == '}') {
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\'u}","");
      uVar8 = (long)unit_string->_M_string_length - (long)local_58;
      if ((string *)unit_string->_M_string_length < local_58 || uVar8 == 0) {
        bVar11 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar8,local_58);
        bVar11 = iVar5 == 0;
      }
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      if (!bVar11) {
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"index}","");
        uVar8 = (long)unit_string->_M_string_length - (long)local_58;
        if ((string *)unit_string->_M_string_length < local_58 || uVar8 == 0) goto LAB_0017cd6c;
        iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar8,local_58);
LAB_0017cd64:
        bVar11 = iVar5 == 0;
        goto LAB_0017cd6e;
      }
      lVar9 = unit_string->_M_string_length - 3;
    }
  }
  else if ((*pcVar1 == '[') && (pcVar1[unit_string->_M_string_length - 1] == ']')) {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"U]","");
    uVar8 = (long)unit_string->_M_string_length - (long)local_58;
    if ((string *)unit_string->_M_string_length < local_58 || uVar8 == 0) {
      bVar11 = false;
    }
    else {
      iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar8,local_58);
      bVar11 = iVar5 == 0;
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if (bVar11) {
      lVar9 = unit_string->_M_string_length - 2;
    }
    else {
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"index]","");
      uVar8 = (long)unit_string->_M_string_length - (long)local_58;
      if (local_58 <= (string *)unit_string->_M_string_length && uVar8 != 0) {
        iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar8,local_58);
        goto LAB_0017cd64;
      }
LAB_0017cd6c:
      bVar11 = false;
LAB_0017cd6e:
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      if (bVar11) {
        lVar9 = unit_string->_M_string_length - 6;
        bVar11 = true;
        goto LAB_0017cd99;
      }
    }
  }
  bVar11 = false;
LAB_0017cd99:
  if (lVar9 == -1) {
    uVar8 = 0xfa94a488;
    dVar12 = NAN;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)unit_string);
    psVar3 = local_58;
    plVar2 = local_60;
    if (bVar11) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,local_60,local_58 + (long)local_60);
      uVar6 = getCommodity(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      uVar8 = (ulong)uVar6 << 0x20 | 0x51800;
    }
    else {
      if (local_58 != (string *)0x0) {
        psVar10 = (string *)0x0;
        do {
          iVar5 = tolower((int)(char)*(string *)((long)plVar2 + (long)psVar10));
          *(string *)((long)plVar2 + (long)psVar10) = SUB41(iVar5,0);
          psVar10 = psVar10 + 1;
        } while (psVar3 != psVar10);
      }
      uVar4 = std::_Hash_bytes(local_60,(ulong)local_58,0xc70f6907);
      uVar7 = precise::custom::custom_unit(uVar4 & 0x3f);
      uVar8 = (ulong)(uint)uVar7;
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    dVar12 = 1.0;
  }
  pVar13.base_units_ = (unit_data)(int)uVar8;
  pVar13.commodity_ = (int)(uVar8 >> 0x20);
  pVar13.multiplier_ = dVar12;
  return pVar13;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}